

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printPixelType(PixelType pt)

{
  long lVar1;
  char *pcVar2;
  
  if (pt == FLOAT) {
    pcVar2 = "32-bit floating-point";
  }
  else {
    if (pt != HALF) {
      if (pt != UINT) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"type ",5);
        std::ostream::operator<<((ostream *)&std::cout,pt);
        return;
      }
      pcVar2 = "32-bit unsigned integer";
      lVar1 = 0x17;
      goto LAB_00103639;
    }
    pcVar2 = "16-bit floating-point";
  }
  lVar1 = 0x15;
LAB_00103639:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  return;
}

Assistant:

void
printPixelType (PixelType pt)
{
    switch (pt)
    {
        case UINT: cout << "32-bit unsigned integer"; break;

        case HALF: cout << "16-bit floating-point"; break;

        case FLOAT: cout << "32-bit floating-point"; break;

        default: cout << "type " << int (pt); break;
    }
}